

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_catalog_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::MacroCatalogEntry::GetInfo(MacroCatalogEntry *this)

{
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *puVar1;
  CreateMacroInfo *this_00;
  pointer pCVar2;
  pointer pMVar3;
  LogicalDependencyList *this_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  pointer *__ptr;
  long in_RSI;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *this_03;
  _Head_base<0UL,_duckdb::CreateMacroInfo_*,_false> local_48;
  _Tuple_impl<0UL,_duckdb::MacroFunction_*,_std::default_delete<duckdb::MacroFunction>_> local_40;
  __uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> local_38;
  
  this_00 = (CreateMacroInfo *)operator_new(0x198);
  CreateMacroInfo::CreateMacroInfo(this_00,*(CatalogType *)(in_RSI + 0x10));
  local_48._M_head_impl = this_00;
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)this;
  Catalog::GetName_abi_cxx11_(*(Catalog **)(in_RSI + 0xd8));
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.catalog);
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.schema);
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar2->super_CreateFunctionInfo).name);
  this_03 = *(unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> **
             )(in_RSI + 0x158);
  puVar1 = *(unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> **)
            (in_RSI + 0x160);
  if (this_03 != puVar1) {
    do {
      pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                             *)&local_48);
      pMVar3 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
               operator->(this_03);
      (*pMVar3->_vptr_MacroFunction[2])(&local_40,pMVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>
                ((vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>>
                  *)&pCVar2->macros,
                 (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                  *)&local_40);
      if (local_40.super__Head_base<0UL,_duckdb::MacroFunction_*,_false>._M_head_impl !=
          (MacroFunction *)0x0) {
        (**(code **)(*(long *)local_40.super__Head_base<0UL,_duckdb::MacroFunction_*,_false>.
                              _M_head_impl + 8))();
      }
      this_03 = this_03 + 1;
    } while (this_03 != puVar1);
  }
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  this_01 = &(pCVar2->super_CreateFunctionInfo).super_CreateInfo.dependencies;
  if ((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)(in_RSI + 0xe8) !=
      (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)this_01) {
    ::std::
    _Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<duckdb::LogicalDependency,duckdb::LogicalDependency,std::allocator<duckdb::LogicalDependency>,std::__detail::_Identity,duckdb::LogicalDependencyEquality,duckdb::LogicalDependencyHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_01,
               (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(in_RSI + 0xe8));
  }
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  Value::operator=(&(pCVar2->super_CreateFunctionInfo).super_CreateInfo.comment,
                   (Value *)(in_RSI + 0x50));
  pCVar2 = unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true>
                       *)&local_48);
  this_02 = &(pCVar2->super_CreateFunctionInfo).super_CreateInfo.tags;
  if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       *)(in_RSI + 0x90) != &this_02->_M_h) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_02,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(in_RSI + 0x90));
  }
  *(CreateMacroInfo **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
   super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = local_48._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> MacroCatalogEntry::GetInfo() const {
	auto info = make_uniq<CreateMacroInfo>(type);
	info->catalog = catalog.GetName();
	info->schema = schema.name;
	info->name = name;
	for (auto &function : macros) {
		info->macros.push_back(function->Copy());
	}
	info->dependencies = dependencies;
	info->comment = comment;
	info->tags = tags;
	return std::move(info);
}